

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

int mctools_exists(mcu8str *rawpath)

{
  int iVar1;
  mcu8str native;
  mcu8str path;
  stat sinfo;
  char buf [4096];
  mcu8str local_10d8;
  mcu8str local_10c0;
  stat local_10a8;
  char local_1018 [4104];
  
  mctools_impl_view_no_winnamespace(&local_10c0,rawpath);
  local_10d8.owns_memory = 0;
  local_10d8.c_str = local_1018;
  local_1018[0] = '\0';
  local_10d8.size = 0;
  local_10d8.buflen = 0x1000;
  mcu8str_assign(&local_10d8,&local_10c0);
  mctools_pathseps_platform(&local_10d8);
  iVar1 = stat(local_10d8.c_str,&local_10a8);
  mcu8str_dealloc(&local_10d8);
  return (int)(iVar1 == 0);
}

Assistant:

int mctools_exists( const mcu8str* rawpath )
  {
    mcu8str path = mctools_impl_view_no_winnamespace( rawpath );
#ifdef MC_IS_WINDOWS
    mcwinstr wpath = mc_path2wpath( &path );
    DWORD fa = GetFileAttributesW( wpath.c_str );
    mc_winstr_dealloc( &wpath );
    return fa == INVALID_FILE_ATTRIBUTES ? 0 : 1;
#else
    char buf[4096];
    mcu8str native = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    mcu8str_assign( &native, &path );
    mctools_pathseps_platform( &native );
    struct stat sinfo;
    int res = ( stat( native.c_str, &sinfo) == 0 ) ? 1 : 0;
    mcu8str_dealloc(&native);
    return res;
#endif
  }